

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

void Gia_ObjComputeTruthTableTest(Gia_Man_t *p)

{
  abctime aVar1;
  Gia_Obj_t *pObj;
  abctime aVar2;
  int v;
  int level;
  Gia_Man_t *pGVar3;
  
  pGVar3 = p;
  aVar1 = Abc_Clock();
  for (v = 0; level = (int)pGVar3, v < p->vCos->nSize - p->nRegs; v = v + 1) {
    pGVar3 = p;
    pObj = Gia_ManCo(p,v);
    level = (int)pGVar3;
    if (pObj == (Gia_Obj_t *)0x0) break;
    pGVar3 = p;
    Gia_ObjComputeTruthTable(p,pObj);
  }
  aVar2 = Abc_Clock();
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
  return;
}

Assistant:

void Gia_ObjComputeTruthTableTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    unsigned * pTruth;
    abctime clk = Abc_Clock();
    int i;
    Gia_ManForEachPo( p, pObj, i )
    {
        pTruth = (unsigned *)Gia_ObjComputeTruthTable( p, pObj );
//        Extra_PrintHex( stdout, pTruth, Gia_ManPiNum(p) ); printf( "\n" );
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}